

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_dump.h
# Opt level: O1

string * __thiscall
LatencyDumpDefaultImpl::dump_abi_cxx11_
          (string *__return_storage_ptr__,LatencyDumpDefaultImpl *this,MapWrapper *map_w,
          LatencyCollectorDumpOptions *opt)

{
  long *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  SortBy SVar4;
  LatencyItem *src;
  pointer pcVar5;
  size_type sVar6;
  undefined8 *puVar7;
  iterator iVar8;
  LatencyItem *this_00;
  _Hash_node_base *p_Var9;
  ostream *poVar10;
  _Base_ptr p_Var11;
  _Rb_tree_node_base *p_Var12;
  long lVar13;
  long lVar14;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
  *__range1;
  undefined1 in_R9B;
  LatencyItem *item;
  string actual_name;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
  map_string;
  multimap<unsigned_long,_LatencyItem_*,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_LatencyItem_*>_>_>
  map_uint64_t;
  stringstream ss;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>
  local_270;
  LatencyCollectorDumpOptions *local_248;
  string local_240;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
  local_220;
  string *local_1f0;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_LatencyItem_*>,_std::_Select1st<std::pair<const_unsigned_long,_LatencyItem_*>_>,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_LatencyItem_*>_>_>
  local_1e8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_248 = opt;
  std::__cxx11::stringstream::stringstream(local_1b8);
  p_Var9 = (map_w->map)._M_h._M_before_begin._M_nxt;
  if (p_Var9 != (_Hash_node_base *)0x0) {
    lVar13 = 0;
    do {
      lVar13 = (lVar13 + 1) - (ulong)(p_Var9[5]._M_nxt[7]._M_nxt == (_Hash_node_base *)0x0);
      p_Var9 = p_Var9->_M_nxt;
    } while (p_Var9 != (_Hash_node_base *)0x0);
    if (lVar13 != 0) {
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_1e8._M_impl.super__Rb_tree_header._M_header;
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1e8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_220._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_220._M_impl.super__Rb_tree_header._M_header;
      local_220._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_220._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_220._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var9 = (map_w->map)._M_h._M_before_begin._M_nxt;
      local_220._M_impl.super__Rb_tree_header._M_header._M_right =
           local_220._M_impl.super__Rb_tree_header._M_header._M_left;
      local_1f0 = __return_storage_ptr__;
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var9 == (_Hash_node_base *)0x0) {
        item = (LatencyItem *)0x9;
      }
      else {
        paVar2 = &local_270.first.field_2;
        item = (LatencyItem *)0x9;
        do {
          src = (LatencyItem *)p_Var9[5]._M_nxt;
          if ((src->hist).count.super___atomic_base<unsigned_long>._M_i != 0) {
            pcVar5 = (src->statName)._M_dataplus._M_p;
            local_270.first._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_270,pcVar5,pcVar5 + (src->statName)._M_string_length);
            getActualFunction(&local_240,&local_270.first,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270.first._M_dataplus._M_p != paVar2) {
              operator_delete(local_270.first._M_dataplus._M_p);
            }
            iVar8 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
                    ::find(&local_220,&local_240);
            if ((_Rb_tree_header *)iVar8._M_node == &local_220._M_impl.super__Rb_tree_header) {
              this_00 = (LatencyItem *)operator_new(0x50);
              LatencyItem::LatencyItem(this_00,src);
              local_270.first._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_270,local_240._M_dataplus._M_p,
                         local_240._M_dataplus._M_p + (long)(string *)local_240._M_string_length);
              local_270.second = this_00;
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,LatencyItem*>,std::_Select1st<std::pair<std::__cxx11::string_const,LatencyItem*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,LatencyItem*>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,LatencyItem*>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,LatencyItem*>,std::_Select1st<std::pair<std::__cxx11::string_const,LatencyItem*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,LatencyItem*>>>
                          *)&local_220,&local_270);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_270.first._M_dataplus._M_p != paVar2) {
                operator_delete(local_270.first._M_dataplus._M_p);
              }
            }
            else {
              lVar13 = *(long *)(iVar8._M_node + 2);
              LOCK();
              *(long *)(lVar13 + 0x38) =
                   *(long *)(lVar13 + 0x38) +
                   (src->hist).count.super___atomic_base<unsigned_long>._M_i;
              UNLOCK();
              LOCK();
              *(long *)(lVar13 + 0x40) =
                   *(long *)(lVar13 + 0x40) +
                   (src->hist).sum.super___atomic_base<unsigned_long>._M_i;
              UNLOCK();
              if (*(ulong *)(lVar13 + 0x48) <
                  (src->hist).max.super___atomic_base<unsigned_long>._M_i) {
                LOCK();
                *(__int_type *)(lVar13 + 0x48) =
                     (src->hist).max.super___atomic_base<unsigned_long>._M_i;
                UNLOCK();
              }
              lVar14 = 0;
              do {
                LOCK();
                plVar1 = (long *)(*(long *)(lVar13 + 0x30) + lVar14 * 8);
                *plVar1 = *plVar1 + (src->hist).bins[lVar14].super___atomic_base<unsigned_long>._M_i
                ;
                UNLOCK();
                lVar14 = lVar14 + 1;
              } while (lVar14 != 0x41);
            }
            if (item < local_240._M_string_length) {
              item = (LatencyItem *)local_240._M_string_length;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240._M_dataplus._M_p != &local_240.field_2) {
              operator_delete(local_240._M_dataplus._M_p);
            }
          }
          p_Var9 = p_Var9->_M_nxt;
        } while (p_Var9 != (_Hash_node_base *)0x0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"# stats: ",9);
      p_Var3 = &local_220._M_impl.super__Rb_tree_header;
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      if ((_Rb_tree_header *)local_220._M_impl.super__Rb_tree_header._M_header._M_left != p_Var3) {
        p_Var11 = local_220._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          sVar6 = *(size_type *)(p_Var11 + 2);
          if (*(long *)(sVar6 + 0x38) != 0) {
            SVar4 = local_248->sort_by;
            if (SVar4 == AVG_LATENCY) {
              if (*(long *)(sVar6 + 0x38) == 0) {
                local_270.first._M_dataplus._M_p = (pointer)0x0;
              }
              else {
                local_270.first._M_dataplus._M_p =
                     (pointer)(*(ulong *)(sVar6 + 0x40) / *(ulong *)(sVar6 + 0x38));
              }
              local_270.first._M_string_length = sVar6;
              std::
              _Rb_tree<unsigned_long,std::pair<unsigned_long_const,LatencyItem*>,std::_Select1st<std::pair<unsigned_long_const,LatencyItem*>>,std::greater<unsigned_long>,std::allocator<std::pair<unsigned_long_const,LatencyItem*>>>
              ::_M_emplace_equal<std::pair<unsigned_long,LatencyItem*>>
                        ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,LatencyItem*>,std::_Select1st<std::pair<unsigned_long_const,LatencyItem*>>,std::greater<unsigned_long>,std::allocator<std::pair<unsigned_long_const,LatencyItem*>>>
                          *)&local_1e8,(pair<unsigned_long,_LatencyItem_*> *)&local_270);
            }
            else if (SVar4 == NUM_CALLS) {
              local_270.first._M_dataplus._M_p = *(pointer *)(sVar6 + 0x38);
              local_270.first._M_string_length = sVar6;
              std::
              _Rb_tree<unsigned_long,std::pair<unsigned_long_const,LatencyItem*>,std::_Select1st<std::pair<unsigned_long_const,LatencyItem*>>,std::greater<unsigned_long>,std::allocator<std::pair<unsigned_long_const,LatencyItem*>>>
              ::_M_emplace_equal<std::pair<unsigned_long,LatencyItem*>>
                        ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,LatencyItem*>,std::_Select1st<std::pair<unsigned_long_const,LatencyItem*>>,std::greater<unsigned_long>,std::allocator<std::pair<unsigned_long_const,LatencyItem*>>>
                          *)&local_1e8,(pair<unsigned_long,_LatencyItem_*> *)&local_270);
            }
            else if (SVar4 == TOTAL_TIME) {
              local_270.first._M_dataplus._M_p = *(pointer *)(sVar6 + 0x40);
              local_270.first._M_string_length = sVar6;
              std::
              _Rb_tree<unsigned_long,std::pair<unsigned_long_const,LatencyItem*>,std::_Select1st<std::pair<unsigned_long_const,LatencyItem*>>,std::greater<unsigned_long>,std::allocator<std::pair<unsigned_long_const,LatencyItem*>>>
              ::_M_emplace_equal<std::pair<unsigned_long,LatencyItem*>>
                        ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,LatencyItem*>,std::_Select1st<std::pair<unsigned_long_const,LatencyItem*>>,std::greater<unsigned_long>,std::allocator<std::pair<unsigned_long_const,LatencyItem*>>>
                          *)&local_1e8,(pair<unsigned_long,_LatencyItem_*> *)&local_270);
            }
          }
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
        } while ((_Rb_tree_header *)p_Var11 != p_Var3);
      }
      addDumpTitle((stringstream *)local_1b8,(size_t)item);
      if (local_248->sort_by == NAME) {
        if ((_Rb_tree_header *)local_220._M_impl.super__Rb_tree_header._M_header._M_left != p_Var3)
        {
          p_Var11 = local_220._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            if ((*(LatencyDumpDefaultImpl **)(p_Var11 + 2))[7].super_LatencyDump._vptr_LatencyDump
                != (_func_int **)0x0) {
              dumpItem_abi_cxx11_(&local_270.first,*(LatencyDumpDefaultImpl **)(p_Var11 + 2),item,0,
                                  0,(bool)in_R9B);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (local_1a8,local_270.first._M_dataplus._M_p,
                                   local_270.first._M_string_length);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_270.first._M_dataplus._M_p != &local_270.first.field_2) {
                operator_delete(local_270.first._M_dataplus._M_p);
              }
            }
            p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
          } while ((_Rb_tree_header *)p_Var11 != &local_220._M_impl.super__Rb_tree_header);
        }
      }
      else if ((_Rb_tree_header *)local_1e8._M_impl.super__Rb_tree_header._M_header._M_left !=
               &local_1e8._M_impl.super__Rb_tree_header) {
        p_Var11 = local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          if (p_Var11[1]._M_parent[1]._M_right != (_Base_ptr)0x0) {
            dumpItem_abi_cxx11_(&local_270.first,(LatencyDumpDefaultImpl *)p_Var11[1]._M_parent,item
                                ,0,0,(bool)in_R9B);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (local_1a8,local_270.first._M_dataplus._M_p,
                                 local_270.first._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270.first._M_dataplus._M_p != &local_270.first.field_2) {
              operator_delete(local_270.first._M_dataplus._M_p);
            }
          }
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
        } while ((_Rb_tree_header *)p_Var11 != &local_1e8._M_impl.super__Rb_tree_header);
      }
      __return_storage_ptr__ = local_1f0;
      for (p_Var12 = local_220._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var12 != &local_220._M_impl.super__Rb_tree_header;
          p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
        puVar7 = *(undefined8 **)(p_Var12 + 2);
        if (puVar7 != (undefined8 *)0x0) {
          if ((void *)puVar7[6] != (void *)0x0) {
            operator_delete__((void *)puVar7[6]);
          }
          if ((undefined8 *)*puVar7 != puVar7 + 2) {
            operator_delete((undefined8 *)*puVar7);
          }
          operator_delete(puVar7);
        }
      }
      std::__cxx11::stringbuf::str();
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
      ::~_Rb_tree(&local_220);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_LatencyItem_*>,_std::_Select1st<std::pair<const_unsigned_long,_LatencyItem_*>_>,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_LatencyItem_*>_>_>
      ::~_Rb_tree(&local_1e8);
      goto LAB_00107808;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"# stats: ",9);
  for (p_Var9 = (map_w->map)._M_h._M_before_begin._M_nxt; p_Var9 != (_Hash_node_base *)0x0;
      p_Var9 = p_Var9->_M_nxt) {
  }
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
LAB_00107808:
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string dump(MapWrapper* map_w,
                     const LatencyCollectorDumpOptions& opt) {
        std::stringstream ss;
        if (!map_w->getSize()) {
            ss << "# stats: " << map_w->getSize() << std::endl;
            return ss.str();
        }

        std::multimap<uint64_t,
                      LatencyItem*,
                      std::greater<uint64_t> > map_uint64_t;
        std::map<std::string, LatencyItem*> map_string;
        size_t max_name_len = 9; // reserved for "STAT NAME" 9 chars

        std::unordered_map<std::string, LatencyItem*>& map = getMap(map_w);

        // Deduplication
        for (auto& entry: map) {
            LatencyItem *item = entry.second;
            if (!item->getNumCalls()) {
                continue;
            }
            std::string actual_name = getActualFunction(item->getName(), false);

            auto existing = map_string.find(actual_name);
            if (existing != map_string.end()) {
                LatencyItem* item_found = existing->second;
                *item_found += *item;
            } else {
                LatencyItem* new_item = new LatencyItem(*item);
                map_string.insert( std::make_pair(actual_name, new_item) );
            }

            if (actual_name.size() > max_name_len) {
                max_name_len = actual_name.size();
            }
        }

        ss << "# stats: " << map_string.size() << std::endl;

        for (auto& entry: map_string) {
            LatencyItem *item = entry.second;
            if (!item->getNumCalls()) continue;

            switch (opt.sort_by) {
            case LatencyCollectorDumpOptions::NAME: {
                // Do nothing
                break;
            }

            // Otherwise: dealing with uint64_t, map_uint64_t.
            case LatencyCollectorDumpOptions::TOTAL_TIME:
                addToUintMap(item->getTotalTime(), map_uint64_t, item);
                break;

            case LatencyCollectorDumpOptions::NUM_CALLS:
                addToUintMap(item->getNumCalls(), map_uint64_t, item);
                break;

            case LatencyCollectorDumpOptions::AVG_LATENCY:
                addToUintMap(item->getAvgLatency(), map_uint64_t, item);
                break;
            }
        }

        addDumpTitle(ss, max_name_len);

        if (opt.sort_by == LatencyCollectorDumpOptions::NAME) {
            // Name (string)
            for (auto& entry: map_string) {
                LatencyItem *item = entry.second;
                if (item->getNumCalls()) {
                    ss << dumpItem(item, max_name_len, 0, false)
                       << std::endl;
                }
            }
        } else {
            // Otherwise (number)
            for (auto& entry: map_uint64_t) {
                LatencyItem *item = entry.second;
                if (item->getNumCalls()) {
                    ss << dumpItem(item, max_name_len, 0, false)
                       << std::endl;
                }
            }
        }

        // Free all.
        for (auto& entry: map_string) {
            delete entry.second;
        }

        return ss.str();
    }